

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::deleteRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  deUint32 *__k;
  ulong uVar1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar2;
  
  uVar1 = (ulong)(uint)numRenderbuffers;
  if (0 < numRenderbuffers) {
    __k = renderbuffers;
    do {
      pVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&(this->m_allocatedRbos)._M_t,__k);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&(this->m_allocatedRbos)._M_t,(_Base_ptr)pVar2.first._M_node,
                     (_Base_ptr)pVar2.second._M_node);
      __k = __k + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  return;
}

Assistant:

void GLContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
		m_allocatedRbos.erase(renderbuffers[i]);
	m_wrapper->glDeleteRenderbuffers(numRenderbuffers, renderbuffers);
}